

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_worker.cpp
# Opt level: O1

int __thiscall Worker::qt_metacall(Worker *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined4 in_register_00000014;
  Call _c_00;
  
  _id_00 = QObject::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (_id_00 < 0) {
    return _id_00;
  }
  if (_c == RegisterMethodArgumentMetaType) {
    if (0x11 < _id_00) goto LAB_00123e2c;
    _c_00 = RegisterMethodArgumentMetaType;
  }
  else {
    if (_c != InvokeMetaMethod) {
      return _id_00;
    }
    if (0x11 < _id_00) goto LAB_00123e2c;
    _c_00 = InvokeMetaMethod;
  }
  qt_static_metacall(&this->super_QObject,_c_00,_id_00,_a);
LAB_00123e2c:
  return _id_00 + -0x12;
}

Assistant:

int Worker::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 18)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 18;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 18)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 18;
    }
    return _id;
}